

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::AddParameter(SQFuncState *this,SQObject *name)

{
  SQObjectPtr *this_00;
  SQObject *in_RSI;
  long in_RDI;
  SQObject *in_stack_00000028;
  SQFuncState *in_stack_00000030;
  SQObjectPtr *this_01;
  sqvector<SQObjectPtr> *in_stack_ffffffffffffffd0;
  SQObjectPtr local_20;
  SQObject *local_10;
  
  local_10 = in_RSI;
  PushLocalVariable(in_stack_00000030,in_stack_00000028);
  this_00 = (SQObjectPtr *)(in_RDI + 0x90);
  this_01 = &local_20;
  ::SQObjectPtr::SQObjectPtr(this_01,local_10);
  sqvector<SQObjectPtr>::push_back(in_stack_ffffffffffffffd0,this_01);
  ::SQObjectPtr::~SQObjectPtr(this_00);
  return;
}

Assistant:

void SQFuncState::AddParameter(const SQObject &name)
{
    PushLocalVariable(name);
    _parameters.push_back(name);
}